

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_group_base.hpp
# Opt level: O1

void __thiscall oqpi::task_group_base::~task_group_base(task_group_base *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  p_Var2 = (this->super_enable_shared_from_this<oqpi::task_group_base>)._M_weak_this.
           super___weak_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  (this->super_task_base)._vptr_task_base = (_func_int **)&PTR__task_base_001f9078;
  p_Var2 = (this->super_task_base).spParentGroup_.
           super___shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

virtual ~task_group_base() = default;